

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_setattributes(HSQUIRRELVM v,SQInteger idx)

{
  SQClass *this;
  SQObjectPtr *pSVar1;
  bool bVar2;
  SQObjectPtr *key;
  SQObjectPtr *val;
  SQRESULT SVar3;
  SQObjectPtr attrs;
  SQObjectPtr *o;
  
  o = (SQObjectPtr *)0x0;
  bVar2 = sq_aux_gettypedarg(v,idx,OT_CLASS,&o);
  if (!bVar2) {
    return -1;
  }
  key = SQVM::GetUp(v,-2);
  SVar3 = -1;
  val = SQVM::GetUp(v,-1);
  pSVar1 = o;
  attrs.super_SQObject._type = OT_NULL;
  attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
  this = (o->super_SQObject)._unVal.pClass;
  if ((key->super_SQObject)._type == OT_NULL) {
    SQObjectPtr::operator=(&attrs,&this->_attributes);
    SQObjectPtr::operator=(&((pSVar1->super_SQObject)._unVal.pClass)->_attributes,val);
  }
  else {
    bVar2 = SQClass::GetAttributes(this,key,&attrs);
    if (!bVar2) {
      sq_throwerror(v,"wrong index");
      goto LAB_00115962;
    }
    SQClass::SetAttributes((pSVar1->super_SQObject)._unVal.pClass,key,val);
  }
  SQVM::Pop(v,2);
  SQVM::Push(v,&attrs);
  SVar3 = 0;
LAB_00115962:
  SQObjectPtr::~SQObjectPtr(&attrs);
  return SVar3;
}

Assistant:

SQRESULT sq_setattributes(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    SQObjectPtr &key = stack_get(v,-2);
    SQObjectPtr &val = stack_get(v,-1);
    SQObjectPtr attrs;
    if(sq_type(key) == OT_NULL) {
        attrs = _class(*o)->_attributes;
        _class(*o)->_attributes = val;
        v->Pop(2);
        v->Push(attrs);
        return SQ_OK;
    }else if(_class(*o)->GetAttributes(key,attrs)) {
        _class(*o)->SetAttributes(key,val);
        v->Pop(2);
        v->Push(attrs);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong index"));
}